

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamANCF_3243.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementBeamANCF_3243::ComputeInternalForcesContIntNoDamping
          (ChElementBeamANCF_3243 *this,ChVectorDynamic<> *Fi)

{
  Matrix<double,__1,__1,_1,__1,__1> *a_lhs;
  double *pdVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  double dVar4;
  ulong uVar5;
  undefined1 (*pauVar6) [16];
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  void *pvVar65;
  ulong uVar66;
  undefined8 *puVar67;
  double *pdVar68;
  char *pcVar69;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  double dVar94;
  double dVar95;
  double dVar96;
  double dVar97;
  double dVar98;
  double dVar99;
  double dVar100;
  double dVar101;
  double dVar102;
  double dVar103;
  double dVar104;
  double dVar105;
  double dVar106;
  double dVar107;
  double dVar108;
  double dVar109;
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  ChMatrixNMc<double,_3_*_NIP,_3> P_Block;
  ChMatrixNMc<double,_3_*_NIP,_3> FC;
  MatrixNx3 QiCompact;
  Matrix3xN e_bar;
  Scalar local_e08;
  undefined1 local_e00 [328];
  double local_cb8;
  undefined1 local_cb0 [16];
  double local_ca0;
  double local_c98;
  double dStack_c90;
  double dStack_c88;
  double dStack_c80;
  double local_c78;
  double dStack_c70;
  double dStack_c68;
  double dStack_c60;
  double local_c58;
  double dStack_c50;
  double dStack_c48;
  double dStack_c40;
  double local_c38;
  double dStack_c30;
  double dStack_c28;
  double dStack_c20;
  double local_c18;
  double dStack_c10;
  double dStack_c08;
  double dStack_c00;
  double local_bf8;
  double dStack_bf0;
  double dStack_be8;
  double dStack_be0;
  double local_bd8;
  double dStack_bd0;
  double dStack_bc8;
  double dStack_bc0;
  double local_bb8;
  double dStack_bb0;
  double dStack_ba8;
  double dStack_ba0;
  double local_b98;
  double dStack_b90;
  double dStack_b88;
  double dStack_b80;
  double local_b78;
  double dStack_b70;
  double local_b68;
  undefined1 local_b60 [16];
  double local_b50;
  undefined1 local_b48 [16];
  double local_b38;
  double local_b30;
  double dStack_b28;
  double dStack_b20;
  double dStack_b18;
  double local_b10;
  double dStack_b08;
  double dStack_b00;
  double dStack_af8;
  double local_af0;
  double dStack_ae8;
  double dStack_ae0;
  double dStack_ad8;
  double local_ad0;
  double dStack_ac8;
  double dStack_ac0;
  double dStack_ab8;
  double local_ab0;
  double dStack_aa8;
  double dStack_aa0;
  double dStack_a98;
  double local_a90;
  double dStack_a88;
  double dStack_a80;
  double dStack_a78;
  double local_a70;
  double dStack_a68;
  double dStack_a60;
  double dStack_a58;
  double local_a50;
  double dStack_a48;
  double dStack_a40;
  double dStack_a38;
  double local_a30;
  double dStack_a28;
  double dStack_a20;
  double dStack_a18;
  double local_a10;
  double dStack_a08;
  double local_a00;
  undefined1 local_9f8 [16];
  double local_9e8;
  undefined1 local_9e0 [16];
  double local_9d0;
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  double local_7c0;
  double dStack_7b8;
  double dStack_7b0;
  double dStack_7a8;
  undefined1 local_7a0 [32];
  double local_780;
  double dStack_778;
  double dStack_770;
  double dStack_768;
  double local_760;
  double dStack_758;
  double dStack_750;
  double dStack_748;
  double local_740;
  double dStack_738;
  double dStack_730;
  double dStack_728;
  double local_720;
  double dStack_718;
  double dStack_710;
  double dStack_708;
  double local_700;
  double dStack_6f8;
  double dStack_6f0;
  double dStack_6e8;
  double local_6e0;
  double dStack_6d8;
  double dStack_6d0;
  double dStack_6c8;
  double local_6c0;
  double dStack_6b8;
  double dStack_6b0;
  double dStack_6a8;
  double local_6a0;
  double dStack_698;
  double dStack_690;
  double dStack_688;
  undefined1 local_680 [32];
  double local_660;
  double dStack_658;
  double dStack_650;
  double dStack_648;
  undefined1 local_638 [32];
  undefined1 local_618 [32];
  double local_5f8;
  double dStack_5f0;
  double dStack_5e8;
  double dStack_5e0;
  undefined1 local_5d8 [32];
  undefined1 local_5b8 [32];
  undefined1 local_598 [32];
  undefined1 local_578 [32];
  undefined1 local_558 [32];
  undefined1 local_538 [32];
  double local_518;
  double dStack_510;
  double local_508;
  undefined1 local_500 [16];
  double local_4f0;
  double local_4e8;
  double dStack_4e0;
  double local_4d8;
  double local_4d0;
  double dStack_4c8;
  double dStack_4c0;
  double dStack_4b8;
  double local_4b0;
  double dStack_4a8;
  double dStack_4a0;
  double dStack_498;
  undefined1 local_490 [32];
  undefined1 local_470 [32];
  double local_450;
  double dStack_448;
  double dStack_440;
  double dStack_438;
  undefined1 local_430 [32];
  undefined1 local_410 [32];
  undefined1 local_3f0 [32];
  undefined1 local_3d0 [32];
  double local_3b0;
  double dStack_3a8;
  double local_3a0;
  undefined1 local_398 [16];
  double local_388;
  double local_380;
  double dStack_378;
  double local_370;
  double local_368;
  double dStack_360;
  double dStack_358;
  double dStack_350;
  double local_348;
  double dStack_340;
  double dStack_338;
  double dStack_330;
  undefined1 local_328 [32];
  undefined1 local_308 [32];
  undefined1 local_2e8 [32];
  undefined1 local_2c8 [32];
  undefined1 local_2a8 [32];
  double local_288;
  double dStack_280;
  double dStack_278;
  double dStack_270;
  undefined1 local_268 [32];
  double local_248;
  double dStack_240;
  double local_238;
  undefined1 local_230 [16];
  double local_220;
  double local_218;
  double dStack_210;
  double local_208;
  Matrix<double,_8,_3,_1,_8,_3> local_200;
  Matrix3xN local_140;
  
  CalcCoordMatrix(this,&local_140);
  if ((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows
      != 8) {
    pcVar69 = 
    "Eigen::Product<Eigen::Transpose<Eigen::Matrix<double, -1, -1, 1>>, Eigen::Transpose<Eigen::Matrix<double, 3, 8, 1>>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Transpose<Eigen::Matrix<double, -1, -1, 1>>, Rhs = Eigen::Transpose<Eigen::Matrix<double, 3, 8, 1>>, Option = 0]"
    ;
LAB_0070adb9:
    __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                  ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,pcVar69);
  }
  a_lhs = &this->m_SD;
  local_e00._0_8_ = a_lhs;
  local_e00._8_8_ = &local_140;
  if ((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols
      != 0x2d) {
    pcVar69 = 
    "void Eigen::PlainObjectBase<Eigen::Matrix<double, 45, 3, 0>>::resize(Index, Index) [Derived = Eigen::Matrix<double, 45, 3, 0>]"
    ;
LAB_0070addb:
    __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                  ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,pcVar69);
  }
  memset((Matrix<double,_45,_3,_0,_45,_3> *)local_638,0,0x438);
  local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.array[0] =
       1.0;
  Eigen::internal::
  generic_product_impl<Eigen::Transpose<Eigen::Matrix<double,-1,-1,1,-1,-1>>,Eigen::Transpose<Eigen::Matrix<double,3,8,1,3,8>>,Eigen::DenseShape,Eigen::DenseShape,8>
  ::scaleAndAddTo<Eigen::Matrix<double,45,3,0,45,3>>
            ((Matrix<double,_45,_3,_0,_45,_3> *)local_638,
             (Transpose<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)local_e00,
             (Transpose<Eigen::Matrix<double,_3,_8,_1,_3,_8>_> *)(local_e00 + 8),
             (Scalar *)&local_200);
  peVar2 = (this->m_material).
           super___shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var3 = (this->m_material).
           super___shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  uVar66 = (this->m_kGQ_D0).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_cols;
  dVar4 = (double)(this->m_kGQ_D0).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_rows;
  if (-1 < (long)(uVar66 | (ulong)dVar4)) {
    local_e00._0_8_ =
         (peVar2->m_D0).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
         m_data.array[0] * 0.5;
    local_e00._16_8_ =
         (this->m_kGQ_D0).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
         .m_data;
    if ((dVar4 == 5.92878775009496e-323) && (uVar66 == 1)) {
      local_700 = local_4b0;
      dStack_6f8 = dStack_4a8;
      dStack_6f0 = dStack_4a0;
      dStack_6e8 = dStack_498;
      local_720 = local_5f8;
      dStack_718 = dStack_5f0;
      dStack_710 = dStack_5e8;
      dStack_708 = dStack_5e0;
      local_8c0 = local_328;
      auVar57._8_8_ = dStack_4a8;
      auVar57._0_8_ = local_4b0;
      auVar57._16_8_ = dStack_4a0;
      auVar57._24_8_ = dStack_498;
      dVar7 = local_618._0_8_;
      dVar18 = local_618._8_8_;
      dVar29 = local_618._16_8_;
      dVar40 = local_618._24_8_;
      local_8a0 = local_578;
      local_820 = local_3f0;
      local_7e0 = local_2a8;
      local_800 = local_3d0;
      local_980 = local_558;
      auVar84 = vmulpd_avx512vl(local_490,local_490);
      local_880 = local_308;
      auVar85 = vmulpd_avx512vl(local_328,local_328);
      local_7a0 = local_268;
      local_6e0 = (local_638._0_8_ * local_638._0_8_ + local_4d0 * local_4d0 + local_368 * local_368
                  + -1.0) * (double)local_e00._0_8_ *
                            *(double *)*(undefined1 (*) [32])local_e00._16_8_;
      dStack_6d8 = (local_638._8_8_ * local_638._8_8_ + dStack_4c8 * dStack_4c8 +
                    dStack_360 * dStack_360 + -1.0) *
                   (double)local_e00._0_8_ * *(double *)(*(undefined1 (*) [32])local_e00._16_8_ + 8)
      ;
      dStack_6d0 = (local_638._16_8_ * local_638._16_8_ + dStack_4c0 * dStack_4c0 +
                    dStack_358 * dStack_358 + -1.0) *
                   (double)local_e00._0_8_ *
                   *(double *)(*(undefined1 (*) [32])local_e00._16_8_ + 0x10);
      dStack_6c8 = (local_638._24_8_ * local_638._24_8_ + dStack_4b8 * dStack_4b8 +
                    dStack_350 * dStack_350 + -1.0) *
                   (double)local_e00._0_8_ *
                   *(double *)(*(undefined1 (*) [32])local_e00._16_8_ + 0x18);
      local_6c0 = (dVar7 * dVar7 + local_4b0 * local_4b0 + local_348 * local_348 + -1.0) *
                  (double)local_e00._0_8_ *
                  *(double *)*(undefined1 (*) [32])(local_e00._16_8_ + 0x20);
      dStack_6b8 = (dVar18 * dVar18 + dStack_4a8 * dStack_4a8 + dStack_340 * dStack_340 + -1.0) *
                   (double)local_e00._0_8_ *
                   *(double *)(*(undefined1 (*) [32])(local_e00._16_8_ + 0x20) + 8);
      dStack_6b0 = (dVar29 * dVar29 + dStack_4a0 * dStack_4a0 + dStack_338 * dStack_338 + -1.0) *
                   (double)local_e00._0_8_ *
                   *(double *)(*(undefined1 (*) [32])(local_e00._16_8_ + 0x20) + 0x10);
      dStack_6a8 = (dVar40 * dVar40 + dStack_498 * dStack_498 + dStack_330 * dStack_330 + -1.0) *
                   (double)local_e00._0_8_ *
                   *(double *)(*(undefined1 (*) [32])(local_e00._16_8_ + 0x20) + 0x18);
      local_6a0 = (local_5f8 * local_5f8 + auVar84._0_8_ + auVar85._0_8_ + -1.0) *
                  (double)local_e00._0_8_ *
                  *(double *)*(undefined1 (*) [32])(local_e00._16_8_ + 0x40);
      dStack_698 = (dStack_5f0 * dStack_5f0 + auVar84._8_8_ + auVar85._8_8_ + -1.0) *
                   (double)local_e00._0_8_ *
                   *(double *)(*(undefined1 (*) [32])(local_e00._16_8_ + 0x40) + 8);
      dStack_690 = (dStack_5e8 * dStack_5e8 + auVar84._16_8_ + auVar85._16_8_ + -1.0) *
                   (double)local_e00._0_8_ *
                   *(double *)(*(undefined1 (*) [32])(local_e00._16_8_ + 0x40) + 0x10);
      dStack_688 = (dStack_5e0 * dStack_5e0 + auVar84._24_8_ + auVar85._24_8_ + -1.0) *
                   (double)local_e00._0_8_ *
                   *(double *)(*(undefined1 (*) [32])(local_e00._16_8_ + 0x40) + 0x18);
      auVar84 = vmulpd_avx512vl(local_5d8,local_5d8);
      dVar8 = local_470._0_8_;
      dVar19 = local_470._8_8_;
      dVar30 = local_470._16_8_;
      dVar41 = local_470._24_8_;
      dVar9 = local_308._0_8_;
      dVar20 = local_308._8_8_;
      dVar31 = local_308._16_8_;
      dVar42 = local_308._24_8_;
      dVar10 = local_5b8._0_8_;
      dVar21 = local_5b8._8_8_;
      dVar32 = local_5b8._16_8_;
      dVar43 = local_5b8._24_8_;
      auVar93._0_8_ = auVar84._0_8_ + dVar8 * dVar8 + dVar9 * dVar9 + -1.0;
      auVar93._8_8_ = auVar84._8_8_ + dVar19 * dVar19 + dVar20 * dVar20 + -1.0;
      auVar93._16_8_ = auVar84._16_8_ + dVar30 * dVar30 + dVar31 * dVar31 + -1.0;
      auVar93._24_8_ = auVar84._24_8_ + dVar41 * dVar41 + dVar42 * dVar42 + -1.0;
      dVar11 = local_2e8._0_8_;
      dVar22 = local_2e8._8_8_;
      dVar33 = local_2e8._16_8_;
      dVar44 = local_2e8._24_8_;
      dVar12 = local_430._0_8_;
      dVar23 = local_430._8_8_;
      dVar34 = local_430._16_8_;
      dVar45 = local_430._24_8_;
      local_860 = local_2e8;
      dVar13 = local_598._0_8_;
      dVar24 = local_598._8_8_;
      dVar35 = local_598._16_8_;
      dVar46 = local_598._24_8_;
      dVar14 = local_2c8._0_8_;
      dVar25 = local_2c8._8_8_;
      dVar36 = local_2c8._16_8_;
      dVar47 = local_2c8._24_8_;
      dVar4 = *(double *)
               ((long)(peVar2->m_D0).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                      m_storage.m_data.array + 8) * 0.5;
      auVar114._8_8_ = dVar4;
      auVar114._0_8_ = dVar4;
      auVar114._16_8_ = dVar4;
      auVar114._24_8_ = dVar4;
      dVar109 = *(double *)
                 ((long)(peVar2->m_D0).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                        m_storage.m_data.array + 0x10) * 0.5;
      auVar84 = vmulpd_avx512vl(auVar114,*(undefined1 (*) [32])local_e00._16_8_);
      local_680 = vmulpd_avx512vl(auVar93,auVar84);
      local_660 = (dVar10 * dVar10 + local_450 * local_450 + dVar11 * dVar11 + -1.0) *
                  dVar4 * *(double *)*(undefined1 (*) [32])(local_e00._16_8_ + 0x20);
      dStack_658 = (dVar21 * dVar21 + dStack_448 * dStack_448 + dVar22 * dVar22 + -1.0) *
                   dVar4 * *(double *)(*(undefined1 (*) [32])(local_e00._16_8_ + 0x20) + 8);
      dStack_650 = (dVar32 * dVar32 + dStack_440 * dStack_440 + dVar33 * dVar33 + -1.0) *
                   dVar4 * *(double *)(*(undefined1 (*) [32])(local_e00._16_8_ + 0x20) + 0x10);
      dStack_648 = (dVar43 * dVar43 + dStack_438 * dStack_438 + dVar44 * dVar44 + -1.0) *
                   dVar4 * *(double *)(*(undefined1 (*) [32])(local_e00._16_8_ + 0x20) + 0x18);
      local_7c0 = local_288;
      dStack_7b8 = dStack_280;
      dStack_7b0 = dStack_278;
      dStack_7a8 = dStack_270;
      dVar94 = (dVar13 * dVar13 + dVar12 * dVar12 + dVar14 * dVar14 + -1.0) *
               dVar4 * *(double *)*(undefined1 (*) [32])(local_e00._16_8_ + 0x40);
      dVar98 = (dVar24 * dVar24 + dVar23 * dVar23 + dVar25 * dVar25 + -1.0) *
               dVar4 * *(double *)(*(undefined1 (*) [32])(local_e00._16_8_ + 0x40) + 8);
      dVar102 = (dVar35 * dVar35 + dVar34 * dVar34 + dVar36 * dVar36 + -1.0) *
                dVar4 * *(double *)(*(undefined1 (*) [32])(local_e00._16_8_ + 0x40) + 0x10);
      dVar106 = (dVar46 * dVar46 + dVar45 * dVar45 + dVar47 * dVar47 + -1.0) *
                dVar4 * *(double *)(*(undefined1 (*) [32])(local_e00._16_8_ + 0x40) + 0x18);
      auVar84 = vmulpd_avx512vl(local_578,local_578);
      dVar15 = local_410._0_8_;
      dVar26 = local_410._8_8_;
      dVar37 = local_410._16_8_;
      dVar48 = local_410._24_8_;
      dVar16 = local_3f0._0_8_;
      dVar27 = local_3f0._8_8_;
      dVar38 = local_3f0._16_8_;
      dVar49 = local_3f0._24_8_;
      auVar85 = vmulpd_avx512vl(local_2a8,local_2a8);
      auVar86 = vmulpd_avx512vl(local_558,local_558);
      auVar87 = vmulpd_avx512vl(local_3d0,local_3d0);
      local_9a0 = local_538;
      dVar17 = local_268._0_8_;
      dVar28 = local_268._8_8_;
      dVar39 = local_268._16_8_;
      dVar50 = local_268._24_8_;
      local_960 = local_430;
      dVar95 = (auVar84._0_8_ + dVar15 * dVar15 + auVar85._0_8_ + -1.0) *
               dVar109 * *(double *)*(undefined1 (*) [32])local_e00._16_8_;
      dVar99 = (auVar84._8_8_ + dVar26 * dVar26 + auVar85._8_8_ + -1.0) *
               dVar109 * *(double *)(*(undefined1 (*) [32])local_e00._16_8_ + 8);
      dVar103 = (auVar84._16_8_ + dVar37 * dVar37 + auVar85._16_8_ + -1.0) *
                dVar109 * *(double *)(*(undefined1 (*) [32])local_e00._16_8_ + 0x10);
      dVar107 = (auVar84._24_8_ + dVar48 * dVar48 + auVar85._24_8_ + -1.0) *
                dVar109 * *(double *)(*(undefined1 (*) [32])local_e00._16_8_ + 0x18);
      dVar96 = (auVar86._0_8_ + dVar16 * dVar16 + local_288 * local_288 + -1.0) *
               dVar109 * *(double *)*(undefined1 (*) [32])(local_e00._16_8_ + 0x20);
      dVar100 = (auVar86._8_8_ + dVar27 * dVar27 + dStack_280 * dStack_280 + -1.0) *
                dVar109 * *(double *)(*(undefined1 (*) [32])(local_e00._16_8_ + 0x20) + 8);
      dVar104 = (auVar86._16_8_ + dVar38 * dVar38 + dStack_278 * dStack_278 + -1.0) *
                dVar109 * *(double *)(*(undefined1 (*) [32])(local_e00._16_8_ + 0x20) + 0x10);
      dVar108 = (auVar86._24_8_ + dVar49 * dVar49 + dStack_270 * dStack_270 + -1.0) *
                dVar109 * *(double *)(*(undefined1 (*) [32])(local_e00._16_8_ + 0x20) + 0x18);
      auVar84 = vmulpd_avx512vl(local_430,local_3d0);
      auVar85._8_8_ = dStack_340;
      auVar85._0_8_ = local_348;
      auVar85._16_8_ = dStack_338;
      auVar85._24_8_ = dStack_330;
      auVar56._8_8_ = dStack_5f0;
      auVar56._0_8_ = local_5f8;
      auVar56._16_8_ = dStack_5e8;
      auVar56._24_8_ = dStack_5e0;
      dVar97 = (local_538._0_8_ * local_538._0_8_ + auVar87._0_8_ + dVar17 * dVar17 + -1.0) *
               dVar109 * *(double *)*(undefined1 (*) [32])(local_e00._16_8_ + 0x40);
      dVar101 = (local_538._8_8_ * local_538._8_8_ + auVar87._8_8_ + dVar28 * dVar28 + -1.0) *
                dVar109 * *(double *)(*(undefined1 (*) [32])(local_e00._16_8_ + 0x40) + 8);
      dVar105 = (local_538._16_8_ * local_538._16_8_ + auVar87._16_8_ + dVar39 * dVar39 + -1.0) *
                dVar109 * *(double *)(*(undefined1 (*) [32])(local_e00._16_8_ + 0x40) + 0x10);
      dVar109 = (local_538._24_8_ * local_538._24_8_ + auVar87._24_8_ + dVar50 * dVar50 + -1.0) *
                dVar109 * *(double *)(*(undefined1 (*) [32])(local_e00._16_8_ + 0x40) + 0x18);
      auVar86 = vmulpd_avx512vl(local_470,local_410);
      auVar88 = vmulpd_avx512vl(local_5d8,local_578);
      auVar89 = vmulpd_avx512vl(local_308,local_2a8);
      auVar90 = vmulpd_avx512vl(local_5b8,local_558);
      local_9c0 = local_2c8;
      local_900 = local_638;
      auVar91 = vmulpd_avx512vl(local_598,local_538);
      auVar87._8_8_ = dStack_360;
      auVar87._0_8_ = local_368;
      auVar87._16_8_ = dStack_358;
      auVar87._24_8_ = dStack_350;
      auVar92 = vmulpd_avx512vl(local_2c8,local_268);
      dVar4 = *(double *)
               ((long)(peVar2->m_D0).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                      m_storage.m_data.array + 0x18);
      local_780 = (auVar88._0_8_ + auVar86._0_8_ + auVar89._0_8_) *
                  dVar4 * *(double *)*(undefined1 (*) [32])local_e00._16_8_;
      dStack_778 = (auVar88._8_8_ + auVar86._8_8_ + auVar89._8_8_) *
                   dVar4 * *(double *)(*(undefined1 (*) [32])local_e00._16_8_ + 8);
      dStack_770 = (auVar88._16_8_ + auVar86._16_8_ + auVar89._16_8_) *
                   dVar4 * *(double *)(*(undefined1 (*) [32])local_e00._16_8_ + 0x10);
      dStack_768 = (auVar88._24_8_ + auVar86._24_8_ + auVar89._24_8_) *
                   dVar4 * *(double *)(*(undefined1 (*) [32])local_e00._16_8_ + 0x18);
      auVar86 = vmulpd_avx512vl(auVar57,local_3f0);
      local_8e0 = local_618;
      local_760 = (auVar90._0_8_ + local_450 * dVar16 + dVar11 * local_288) *
                  dVar4 * *(double *)*(undefined1 (*) [32])(local_e00._16_8_ + 0x20);
      dStack_758 = (auVar90._8_8_ + dStack_448 * dVar27 + dVar22 * dStack_280) *
                   dVar4 * *(double *)(*(undefined1 (*) [32])(local_e00._16_8_ + 0x20) + 8);
      dStack_750 = (auVar90._16_8_ + dStack_440 * dVar38 + dVar33 * dStack_278) *
                   dVar4 * *(double *)(*(undefined1 (*) [32])(local_e00._16_8_ + 0x20) + 0x10);
      dStack_748 = (auVar90._24_8_ + dStack_438 * dVar49 + dVar44 * dStack_270) *
                   dVar4 * *(double *)(*(undefined1 (*) [32])(local_e00._16_8_ + 0x20) + 0x18);
      local_940 = local_5d8;
      local_740 = (auVar91._0_8_ + auVar84._0_8_ + auVar92._0_8_) *
                  dVar4 * *(double *)*(undefined1 (*) [32])(local_e00._16_8_ + 0x40);
      dStack_738 = (auVar91._8_8_ + auVar84._8_8_ + auVar92._8_8_) *
                   dVar4 * *(double *)(*(undefined1 (*) [32])(local_e00._16_8_ + 0x40) + 8);
      dStack_730 = (auVar91._16_8_ + auVar84._16_8_ + auVar92._16_8_) *
                   dVar4 * *(double *)(*(undefined1 (*) [32])(local_e00._16_8_ + 0x40) + 0x10);
      dStack_728 = (auVar91._24_8_ + auVar84._24_8_ + auVar92._24_8_) *
                   dVar4 * *(double *)(*(undefined1 (*) [32])(local_e00._16_8_ + 0x40) + 0x18);
      auVar84 = vmulpd_avx512vl(local_638,local_578);
      auVar89._8_8_ = dStack_4c8;
      auVar89._0_8_ = local_4d0;
      auVar89._16_8_ = dStack_4c0;
      auVar89._24_8_ = dStack_4b8;
      auVar88 = vmulpd_avx512vl(local_490,local_3d0);
      auVar90 = vmulpd_avx512vl(auVar89,local_410);
      auVar87 = vmulpd_avx512vl(auVar87,local_2a8);
      auVar110._0_8_ = auVar84._0_8_ + auVar90._0_8_ + auVar87._0_8_;
      auVar110._8_8_ = auVar84._8_8_ + auVar90._8_8_ + auVar87._8_8_;
      auVar110._16_8_ = auVar84._16_8_ + auVar90._16_8_ + auVar87._16_8_;
      auVar110._24_8_ = auVar84._24_8_ + auVar90._24_8_ + auVar87._24_8_;
      auVar84 = vmulpd_avx512vl(local_618,local_558);
      auVar112._0_8_ = auVar84._0_8_ + auVar86._0_8_ + local_348 * local_288;
      auVar112._8_8_ = auVar84._8_8_ + auVar86._8_8_ + dStack_340 * dStack_280;
      auVar112._16_8_ = auVar84._16_8_ + auVar86._16_8_ + dStack_338 * dStack_278;
      auVar112._24_8_ = auVar84._24_8_ + auVar86._24_8_ + dStack_330 * dStack_270;
      auVar84 = vmulpd_avx512vl(auVar56,local_538);
      auVar84 = vaddpd_avx512vl(auVar84,auVar88);
      auVar86 = vmulpd_avx512vl(local_328,local_268);
      auVar84 = vaddpd_avx512vl(auVar84,auVar86);
      auVar71._8_8_ = 0;
      auVar71._0_8_ =
           *(double *)
            ((long)(peVar2->m_D0).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                   m_storage.m_data.array + 0x20);
      vmovsd_avx512f(auVar71);
      auVar70._8_8_ = 0;
      auVar70._0_8_ = dVar4;
      auVar86 = vbroadcastsd_avx512vl(auVar70);
      auVar87 = vmulpd_avx512vl(auVar86,*(undefined1 (*) [32])local_e00._16_8_);
      auVar87 = vmulpd_avx512vl(auVar110,auVar87);
      auVar88 = vmulpd_avx512vl(auVar86,*(undefined1 (*) [32])(local_e00._16_8_ + 0x20));
      local_840 = vmulpd_avx512vl(auVar112,auVar88);
      auVar86 = vmulpd_avx512vl(auVar86,*(undefined1 (*) [32])(local_e00._16_8_ + 0x40));
      local_920 = local_5b8;
      auVar93 = vmulpd_avx512vl(auVar84,auVar86);
      auVar86 = vmulpd_avx512vl(local_638,local_5d8);
      auVar84._8_8_ = dStack_448;
      auVar84._0_8_ = local_450;
      auVar84._16_8_ = dStack_440;
      auVar84._24_8_ = dStack_438;
      auVar88 = vmulpd_avx512vl(local_618,local_5b8);
      auVar90 = vmulpd_avx512vl(local_328,local_2c8);
      auVar58._8_8_ = dStack_6d8;
      auVar58._0_8_ = local_6e0;
      auVar58._16_8_ = dStack_6d0;
      auVar58._24_8_ = dStack_6c8;
      auVar84 = vmulpd_avx512vl(auVar57,auVar84);
      auVar85 = vmulpd_avx512vl(auVar85,local_2e8);
      auVar60._8_8_ = dStack_698;
      auVar60._0_8_ = local_6a0;
      auVar60._16_8_ = dStack_690;
      auVar60._24_8_ = dStack_688;
      dVar4 = *(double *)
               ((long)(peVar2->m_D0).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                      m_storage.m_data.array + 0x28);
      auVar115._0_8_ =
           (auVar86._0_8_ + local_4d0 * dVar8 + local_368 * dVar9) *
           dVar4 * *(double *)*(undefined1 (*) [32])local_e00._16_8_;
      auVar115._8_8_ =
           (auVar86._8_8_ + dStack_4c8 * dVar19 + dStack_360 * dVar20) *
           dVar4 * *(double *)(*(undefined1 (*) [32])local_e00._16_8_ + 8);
      auVar115._16_8_ =
           (auVar86._16_8_ + dStack_4c0 * dVar30 + dStack_358 * dVar31) *
           dVar4 * *(double *)(*(undefined1 (*) [32])local_e00._16_8_ + 0x10);
      auVar115._24_8_ =
           (auVar86._24_8_ + dStack_4b8 * dVar41 + dStack_350 * dVar42) *
           dVar4 * *(double *)(*(undefined1 (*) [32])local_e00._16_8_ + 0x18);
      auVar113._0_8_ =
           (auVar88._0_8_ + auVar84._0_8_ + auVar85._0_8_) *
           dVar4 * *(double *)*(undefined1 (*) [32])(local_e00._16_8_ + 0x20);
      auVar113._8_8_ =
           (auVar88._8_8_ + auVar84._8_8_ + auVar85._8_8_) *
           dVar4 * *(double *)(*(undefined1 (*) [32])(local_e00._16_8_ + 0x20) + 8);
      auVar113._16_8_ =
           (auVar88._16_8_ + auVar84._16_8_ + auVar85._16_8_) *
           dVar4 * *(double *)(*(undefined1 (*) [32])(local_e00._16_8_ + 0x20) + 0x10);
      auVar113._24_8_ =
           (auVar88._24_8_ + auVar84._24_8_ + auVar85._24_8_) *
           dVar4 * *(double *)(*(undefined1 (*) [32])(local_e00._16_8_ + 0x20) + 0x18);
      auVar84 = vmulpd_avx512vl(local_638,auVar58);
      auVar111._0_8_ =
           (dVar13 * local_5f8 + dVar12 * local_490._0_8_ + auVar90._0_8_) *
           dVar4 * *(double *)*(undefined1 (*) [32])(local_e00._16_8_ + 0x40);
      auVar111._8_8_ =
           (dVar24 * dStack_5f0 + dVar23 * local_490._8_8_ + auVar90._8_8_) *
           dVar4 * *(double *)(*(undefined1 (*) [32])(local_e00._16_8_ + 0x40) + 8);
      auVar111._16_8_ =
           (dVar35 * dStack_5e8 + dVar34 * local_490._16_8_ + auVar90._16_8_) *
           dVar4 * *(double *)(*(undefined1 (*) [32])(local_e00._16_8_ + 0x40) + 0x10);
      auVar111._24_8_ =
           (dVar46 * dStack_5e0 + dVar45 * local_490._24_8_ + auVar90._24_8_) *
           dVar4 * *(double *)(*(undefined1 (*) [32])(local_e00._16_8_ + 0x40) + 0x18);
      auVar59._8_8_ = dStack_6b8;
      auVar59._0_8_ = local_6c0;
      auVar59._16_8_ = dStack_6b0;
      auVar59._24_8_ = dStack_6a8;
      auVar85 = vmulpd_avx512vl(local_578,auVar87);
      local_e00._0_8_ = auVar85._0_8_ + auVar84._0_8_ + local_5d8._0_8_ * auVar115._0_8_;
      local_e00._8_8_ = auVar85._8_8_ + auVar84._8_8_ + local_5d8._8_8_ * auVar115._8_8_;
      local_e00._16_8_ = auVar85._16_8_ + auVar84._16_8_ + local_5d8._16_8_ * auVar115._16_8_;
      local_e00._24_8_ = auVar85._24_8_ + auVar84._24_8_ + local_5d8._24_8_ * auVar115._24_8_;
      auVar84 = vmulpd_avx512vl(local_5b8,auVar113);
      auVar85 = vmulpd_avx512vl(local_558,local_840);
      local_e00._32_8_ = auVar85._0_8_ + dVar7 * local_6c0 + auVar84._0_8_;
      local_e00._40_8_ = auVar85._8_8_ + dVar18 * dStack_6b8 + auVar84._8_8_;
      local_e00._48_8_ = auVar85._16_8_ + dVar29 * dStack_6b0 + auVar84._16_8_;
      local_e00._56_8_ = auVar85._24_8_ + dVar40 * dStack_6a8 + auVar84._24_8_;
      auVar84 = vmulpd_avx512vl(auVar56,auVar60);
      auVar85 = vmulpd_avx512vl(local_538,auVar93);
      local_e00._64_8_ = auVar85._0_8_ + auVar84._0_8_ + dVar13 * auVar111._0_8_;
      local_e00._72_8_ = auVar85._8_8_ + auVar84._8_8_ + dVar24 * auVar111._8_8_;
      local_e00._80_8_ = auVar85._16_8_ + auVar84._16_8_ + dVar35 * auVar111._16_8_;
      local_e00._88_8_ = auVar85._24_8_ + auVar84._24_8_ + dVar46 * auVar111._24_8_;
      auVar61._8_8_ = dStack_658;
      auVar61._0_8_ = local_660;
      auVar61._16_8_ = dStack_650;
      auVar61._24_8_ = dStack_648;
      auVar84 = vmulpd_avx512vl(auVar89,auVar58);
      auVar88._8_8_ = dStack_360;
      auVar88._0_8_ = local_368;
      auVar88._16_8_ = dStack_358;
      auVar88._24_8_ = dStack_350;
      auVar85 = vmulpd_avx512vl(local_410,auVar87);
      local_c98 = auVar85._0_8_ + auVar84._0_8_ + dVar8 * auVar115._0_8_;
      dStack_c90 = auVar85._8_8_ + auVar84._8_8_ + dVar19 * auVar115._8_8_;
      dStack_c88 = auVar85._16_8_ + auVar84._16_8_ + dVar30 * auVar115._16_8_;
      dStack_c80 = auVar85._24_8_ + auVar84._24_8_ + dVar41 * auVar115._24_8_;
      auVar84 = vmulpd_avx512vl(auVar57,auVar59);
      auVar85 = vmulpd_avx512vl(local_3f0,local_840);
      local_c78 = auVar85._0_8_ + auVar84._0_8_ + local_450 * auVar113._0_8_;
      dStack_c70 = auVar85._8_8_ + auVar84._8_8_ + dStack_448 * auVar113._8_8_;
      dStack_c68 = auVar85._16_8_ + auVar84._16_8_ + dStack_440 * auVar113._16_8_;
      dStack_c60 = auVar85._24_8_ + auVar84._24_8_ + dStack_438 * auVar113._24_8_;
      auVar91._8_8_ = dVar98;
      auVar91._0_8_ = dVar94;
      auVar91._16_8_ = dVar102;
      auVar91._24_8_ = dVar106;
      auVar84 = vmulpd_avx512vl(local_490,auVar60);
      auVar85 = vmulpd_avx512vl(local_3d0,auVar93);
      auVar86._8_8_ = dStack_340;
      auVar86._0_8_ = local_348;
      auVar86._16_8_ = dStack_338;
      auVar86._24_8_ = dStack_330;
      local_c58 = auVar85._0_8_ + auVar84._0_8_ + dVar12 * auVar111._0_8_;
      dStack_c50 = auVar85._8_8_ + auVar84._8_8_ + dVar23 * auVar111._8_8_;
      dStack_c48 = auVar85._16_8_ + auVar84._16_8_ + dVar34 * auVar111._16_8_;
      dStack_c40 = auVar85._24_8_ + auVar84._24_8_ + dVar45 * auVar111._24_8_;
      auVar84 = vmulpd_avx512vl(auVar88,auVar58);
      auVar85 = vmulpd_avx512vl(local_308,auVar115);
      auVar89 = vmulpd_avx512vl(local_2a8,auVar87);
      local_b30 = auVar89._0_8_ + auVar84._0_8_ + auVar85._0_8_;
      dStack_b28 = auVar89._8_8_ + auVar84._8_8_ + auVar85._8_8_;
      dStack_b20 = auVar89._16_8_ + auVar84._16_8_ + auVar85._16_8_;
      dStack_b18 = auVar89._24_8_ + auVar84._24_8_ + auVar85._24_8_;
      auVar84 = vmulpd_avx512vl(local_2e8,auVar113);
      auVar85 = vmulpd_avx512vl(auVar86,auVar59);
      auVar54._8_8_ = dStack_758;
      auVar54._0_8_ = local_760;
      auVar54._16_8_ = dStack_750;
      auVar54._24_8_ = dStack_748;
      local_b10 = local_288 * local_840._0_8_ + auVar85._0_8_ + auVar84._0_8_;
      dStack_b08 = dStack_280 * local_840._8_8_ + auVar85._8_8_ + auVar84._8_8_;
      dStack_b00 = dStack_278 * local_840._16_8_ + auVar85._16_8_ + auVar84._16_8_;
      dStack_af8 = dStack_270 * local_840._24_8_ + auVar85._24_8_ + auVar84._24_8_;
      auVar55._8_8_ = dStack_738;
      auVar55._0_8_ = local_740;
      auVar55._16_8_ = dStack_730;
      auVar55._24_8_ = dStack_728;
      auVar84 = vmulpd_avx512vl(local_268,auVar93);
      local_af0 = auVar84._0_8_ + local_328._0_8_ * local_6a0 + dVar14 * auVar111._0_8_;
      dStack_ae8 = auVar84._8_8_ + local_328._8_8_ * dStack_698 + dVar25 * auVar111._8_8_;
      dStack_ae0 = auVar84._16_8_ + local_328._16_8_ * dStack_690 + dVar36 * auVar111._16_8_;
      dStack_ad8 = auVar84._24_8_ + local_328._24_8_ * dStack_688 + dVar47 * auVar111._24_8_;
      auVar84 = vmulpd_avx512vl(local_638,auVar115);
      auVar85 = vmulpd_avx512vl(local_5d8,local_680);
      auVar53._8_8_ = dStack_778;
      auVar53._0_8_ = local_780;
      auVar53._16_8_ = dStack_770;
      auVar53._24_8_ = dStack_768;
      auVar89 = vmulpd_avx512vl(local_578,auVar53);
      local_e00._96_8_ = auVar89._0_8_ + auVar85._0_8_ + auVar84._0_8_;
      local_e00._104_8_ = auVar89._8_8_ + auVar85._8_8_ + auVar84._8_8_;
      local_e00._112_8_ = auVar89._16_8_ + auVar85._16_8_ + auVar84._16_8_;
      local_e00._120_8_ = auVar89._24_8_ + auVar85._24_8_ + auVar84._24_8_;
      auVar84 = vmulpd_avx512vl(local_5b8,auVar61);
      auVar85 = vmulpd_avx512vl(local_618,auVar113);
      auVar89 = vmulpd_avx512vl(local_558,auVar54);
      local_e00._128_8_ = auVar89._0_8_ + auVar84._0_8_ + auVar85._0_8_;
      local_e00._136_8_ = auVar89._8_8_ + auVar84._8_8_ + auVar85._8_8_;
      local_e00._144_8_ = auVar89._16_8_ + auVar84._16_8_ + auVar85._16_8_;
      local_e00._152_8_ = auVar89._24_8_ + auVar84._24_8_ + auVar85._24_8_;
      auVar84 = vmulpd_avx512vl(local_598,auVar91);
      auVar90._8_8_ = dStack_4c8;
      auVar90._0_8_ = local_4d0;
      auVar90._16_8_ = dStack_4c0;
      auVar90._24_8_ = dStack_4b8;
      auVar85 = vmulpd_avx512vl(auVar56,auVar111);
      auVar89 = vmulpd_avx512vl(local_538,auVar55);
      local_e00._160_8_ = auVar89._0_8_ + auVar84._0_8_ + auVar85._0_8_;
      local_e00._168_8_ = auVar89._8_8_ + auVar84._8_8_ + auVar85._8_8_;
      local_e00._176_8_ = auVar89._16_8_ + auVar84._16_8_ + auVar85._16_8_;
      local_e00._184_8_ = auVar89._24_8_ + auVar84._24_8_ + auVar85._24_8_;
      auVar84 = vmulpd_avx512vl(local_470,local_680);
      auVar85 = vmulpd_avx512vl(auVar90,auVar115);
      auVar89 = vmulpd_avx512vl(local_410,auVar53);
      local_c38 = auVar89._0_8_ + auVar84._0_8_ + auVar85._0_8_;
      dStack_c30 = auVar89._8_8_ + auVar84._8_8_ + auVar85._8_8_;
      dStack_c28 = auVar89._16_8_ + auVar84._16_8_ + auVar85._16_8_;
      dStack_c20 = auVar89._24_8_ + auVar84._24_8_ + auVar85._24_8_;
      auVar84 = vmulpd_avx512vl(auVar57,auVar113);
      auVar85 = vmulpd_avx512vl(auVar86,auVar113);
      auVar89 = vmulpd_avx512vl(local_3f0,auVar54);
      local_c18 = auVar89._0_8_ + local_450 * local_660 + auVar84._0_8_;
      dStack_c10 = auVar89._8_8_ + dStack_448 * dStack_658 + auVar84._8_8_;
      dStack_c08 = auVar89._16_8_ + dStack_440 * dStack_650 + auVar84._16_8_;
      dStack_c00 = auVar89._24_8_ + dStack_438 * dStack_648 + auVar84._24_8_;
      auVar84 = vmulpd_avx512vl(local_430,auVar91);
      auVar89 = vmulpd_avx512vl(local_490,auVar111);
      local_bf8 = local_3d0._0_8_ * local_740 + auVar84._0_8_ + auVar89._0_8_;
      dStack_bf0 = local_3d0._8_8_ * dStack_738 + auVar84._8_8_ + auVar89._8_8_;
      dStack_be8 = local_3d0._16_8_ * dStack_730 + auVar84._16_8_ + auVar89._16_8_;
      dStack_be0 = local_3d0._24_8_ * dStack_728 + auVar84._24_8_ + auVar89._24_8_;
      auVar84 = vmulpd_avx512vl(local_308,local_680);
      auVar92._8_8_ = dVar99;
      auVar92._0_8_ = dVar95;
      auVar92._16_8_ = dVar103;
      auVar92._24_8_ = dVar107;
      auVar89 = vmulpd_avx512vl(local_2a8,auVar53);
      local_ad0 = auVar89._0_8_ + auVar84._0_8_ + local_368 * auVar115._0_8_;
      dStack_ac8 = auVar89._8_8_ + auVar84._8_8_ + dStack_360 * auVar115._8_8_;
      dStack_ac0 = auVar89._16_8_ + auVar84._16_8_ + dStack_358 * auVar115._16_8_;
      dStack_ab8 = auVar89._24_8_ + auVar84._24_8_ + dStack_350 * auVar115._24_8_;
      auVar84 = vmulpd_avx512vl(local_2e8,auVar61);
      auVar51._8_8_ = dVar100;
      auVar51._0_8_ = dVar96;
      auVar51._16_8_ = dVar104;
      auVar51._24_8_ = dVar108;
      local_ab0 = local_288 * local_760 + auVar84._0_8_ + auVar85._0_8_;
      dStack_aa8 = dStack_280 * dStack_758 + auVar84._8_8_ + auVar85._8_8_;
      dStack_aa0 = dStack_278 * dStack_750 + auVar84._16_8_ + auVar85._16_8_;
      dStack_a98 = dStack_270 * dStack_748 + auVar84._24_8_ + auVar85._24_8_;
      local_a90 = dVar17 * local_740 + dVar94 * dVar14 + local_328._0_8_ * auVar111._0_8_;
      dStack_a88 = dVar28 * dStack_738 + dVar98 * dVar25 + local_328._8_8_ * auVar111._8_8_;
      dStack_a80 = dVar39 * dStack_730 + dVar102 * dVar36 + local_328._16_8_ * auVar111._16_8_;
      dStack_a78 = dVar50 * dStack_728 + dVar106 * dVar47 + local_328._24_8_ * auVar111._24_8_;
      auVar84 = vmulpd_avx512vl(auVar53,local_5d8);
      auVar85 = vmulpd_avx512vl(auVar87,local_638);
      auVar89 = vmulpd_avx512vl(local_578,auVar92);
      local_e00._192_8_ = auVar89._0_8_ + auVar84._0_8_ + auVar85._0_8_;
      local_e00._200_8_ = auVar89._8_8_ + auVar84._8_8_ + auVar85._8_8_;
      local_e00._208_8_ = auVar89._16_8_ + auVar84._16_8_ + auVar85._16_8_;
      local_e00._216_8_ = auVar89._24_8_ + auVar84._24_8_ + auVar85._24_8_;
      auVar84 = vmulpd_avx512vl(local_558,auVar51);
      local_e00._224_8_ = auVar84._0_8_ + local_760 * dVar10 + local_840._0_8_ * dVar7;
      local_e00._232_8_ = auVar84._8_8_ + dStack_758 * dVar21 + local_840._8_8_ * dVar18;
      local_e00._240_8_ = auVar84._16_8_ + dStack_750 * dVar32 + local_840._16_8_ * dVar29;
      local_e00._248_8_ = auVar84._24_8_ + dStack_748 * dVar43 + local_840._24_8_ * dVar40;
      auVar52._8_8_ = dVar101;
      auVar52._0_8_ = dVar97;
      auVar52._16_8_ = dVar105;
      auVar52._24_8_ = dVar109;
      auVar84 = vmulpd_avx512vl(auVar56,auVar93);
      auVar85 = vmulpd_avx512vl(local_538,auVar52);
      local_e00._256_8_ = auVar85._0_8_ + local_740 * dVar13 + auVar84._0_8_;
      local_e00._264_8_ = auVar85._8_8_ + dStack_738 * dVar24 + auVar84._8_8_;
      local_e00._272_8_ = auVar85._16_8_ + dStack_730 * dVar35 + auVar84._16_8_;
      local_e00._280_8_ = auVar85._24_8_ + dStack_728 * dVar46 + auVar84._24_8_;
      auVar84 = vmulpd_avx512vl(auVar53,local_470);
      auVar85 = vmulpd_avx512vl(auVar90,auVar87);
      local_bd8 = dVar95 * dVar15 + auVar84._0_8_ + auVar85._0_8_;
      dStack_bd0 = dVar99 * dVar26 + auVar84._8_8_ + auVar85._8_8_;
      dStack_bc8 = dVar103 * dVar37 + auVar84._16_8_ + auVar85._16_8_;
      dStack_bc0 = dVar107 * dVar48 + auVar84._24_8_ + auVar85._24_8_;
      auVar84 = vmulpd_avx512vl(local_2e8,auVar54);
      auVar85 = vmulpd_avx512vl(auVar57,local_840);
      auVar89 = vmulpd_avx512vl(local_3f0,auVar51);
      local_bb8 = auVar89._0_8_ + local_450 * local_760 + auVar85._0_8_;
      dStack_bb0 = auVar89._8_8_ + dStack_448 * dStack_758 + auVar85._8_8_;
      dStack_ba8 = auVar89._16_8_ + dStack_440 * dStack_750 + auVar85._16_8_;
      dStack_ba0 = auVar89._24_8_ + dStack_438 * dStack_748 + auVar85._24_8_;
      auVar85 = vmulpd_avx512vl(local_430,auVar55);
      auVar89 = vmulpd_avx512vl(local_490,auVar93);
      local_b98 = local_3d0._0_8_ * dVar97 + auVar85._0_8_ + auVar89._0_8_;
      dStack_b90 = local_3d0._8_8_ * dVar101 + auVar85._8_8_ + auVar89._8_8_;
      dStack_b88 = local_3d0._16_8_ * dVar105 + auVar85._16_8_ + auVar89._16_8_;
      dStack_b80 = local_3d0._24_8_ * dVar109 + auVar85._24_8_ + auVar89._24_8_;
      auVar85 = vmulpd_avx512vl(local_308,auVar53);
      auVar87 = vmulpd_avx512vl(auVar88,auVar87);
      local_a70 = dVar95 * local_2a8._0_8_ + auVar85._0_8_ + auVar87._0_8_;
      dStack_a68 = dVar99 * local_2a8._8_8_ + auVar85._8_8_ + auVar87._8_8_;
      dStack_a60 = dVar103 * local_2a8._16_8_ + auVar85._16_8_ + auVar87._16_8_;
      dStack_a58 = dVar107 * local_2a8._24_8_ + auVar85._24_8_ + auVar87._24_8_;
      auVar85 = vmulpd_avx512vl(local_328,auVar93);
      auVar86 = vmulpd_avx512vl(auVar86,local_840);
      local_a50 = local_288 * dVar96 + auVar84._0_8_ + auVar86._0_8_;
      dStack_a48 = dStack_280 * dVar100 + auVar84._8_8_ + auVar86._8_8_;
      dStack_a40 = dStack_278 * dVar104 + auVar84._16_8_ + auVar86._16_8_;
      dStack_a38 = dStack_270 * dVar108 + auVar84._24_8_ + auVar86._24_8_;
      local_a30 = dVar17 * dVar97 + local_740 * dVar14 + auVar85._0_8_;
      dStack_a28 = dVar28 * dVar101 + dStack_738 * dVar25 + auVar85._8_8_;
      dStack_a20 = dVar39 * dVar105 + dStack_730 * dVar36 + auVar85._16_8_;
      dStack_a18 = dVar50 * dVar109 + dStack_728 * dVar47 + auVar85._24_8_;
      uVar66 = (this->m_kGQ_Dv).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_cols;
      uVar5 = (this->m_kGQ_Dv).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_rows;
      if ((long)(uVar66 | uVar5) < 0) goto LAB_0070ad1b;
      if ((uVar5 == 3) && (uVar66 == 1)) {
        pauVar6 = (undefined1 (*) [16])
                  (this->m_kGQ_Dv).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_data;
        auVar70 = vmovddup_avx512vl(ZEXT816(0xbff0000000000000));
        p_Var3 = (this->m_material).
                 super___shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
        auVar118._8_8_ = 0;
        auVar118._0_8_ = local_370;
        auVar71 = vmulsd_avx512f(auVar118,auVar118);
        auVar73._0_8_ = local_518 * local_518 + local_3b0 * local_3b0 + local_248 * local_248 + -1.0
        ;
        auVar73._8_8_ =
             dStack_510 * dStack_510 + dStack_3a8 * dStack_3a8 + dStack_240 * dStack_240 + -1.0;
        auVar72._8_8_ = 0x3fe0000000000000;
        auVar72._0_8_ = 0x3fe0000000000000;
        auVar72 = vmulpd_avx512vl(*pauVar6,auVar72);
        auVar73 = vmulpd_avx512vl(auVar73,auVar72);
        peVar2 = (this->m_material).
                 super___shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        dVar4 = *(double *)pauVar6[1] * 0.5;
        auVar75._8_8_ = 0;
        auVar75._0_8_ = local_238 * local_238 + local_508 * local_508 + local_3a0 * local_3a0 + -1.0
        ;
        auVar116._8_8_ = 0;
        auVar116._0_8_ = dVar4;
        auVar74 = vmulsd_avx512f(auVar75,auVar116);
        auVar80._0_8_ =
             local_500._0_8_ * local_500._0_8_ + local_398._0_8_ * local_398._0_8_ +
             local_230._0_8_ * local_230._0_8_;
        auVar80._8_8_ =
             local_500._8_8_ * local_500._8_8_ + local_398._8_8_ * local_398._8_8_ +
             local_230._8_8_ * local_230._8_8_;
        auVar75 = vaddpd_avx512vl(auVar80,auVar70);
        auVar75 = vmulpd_avx512vl(auVar72,auVar75);
        auVar83._8_8_ = 0;
        auVar83._0_8_ = local_220;
        auVar76 = vmulsd_avx512f(auVar83,auVar83);
        auVar81._8_8_ = 0;
        auVar81._0_8_ = local_4f0 * local_4f0 + local_388 * local_388;
        auVar76 = vaddsd_avx512f(auVar81,auVar76);
        auVar76 = vaddsd_avx512f(auVar76,ZEXT816(0xbff0000000000000));
        auVar76 = vmulsd_avx512f(auVar116,auVar76);
        auVar78._0_8_ = local_4e8 * local_4e8 + local_380 * local_380 + local_218 * local_218;
        auVar78._8_8_ = dStack_4e0 * dStack_4e0 + dStack_378 * dStack_378 + dStack_210 * dStack_210;
        auVar70 = vaddpd_avx512vl(auVar78,auVar70);
        auVar70 = vmulpd_avx512vl(auVar72,auVar70);
        auVar82._8_8_ = 0;
        auVar82._0_8_ = local_4d8 * local_4d8;
        auVar71 = vaddsd_avx512f(auVar82,auVar71);
        auVar119._8_8_ = 0;
        auVar119._0_8_ = local_208;
        auVar72 = vmulsd_avx512f(auVar119,auVar119);
        auVar71 = vaddsd_avx512f(auVar71,auVar72);
        auVar71 = vaddsd_avx512f(auVar71,ZEXT816(0xbff0000000000000));
        auVar79._8_8_ = 0;
        auVar79._0_8_ = dVar4;
        auVar77 = vmulsd_avx512f(auVar79,auVar71);
        if (p_Var3 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          auVar71 = *(undefined1 (*) [16])
                     (peVar2->m_Dv).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                     m_storage.m_data.array;
          auVar72 = *(undefined1 (*) [16])
                     ((long)(peVar2->m_Dv).
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                            m_data.array + 0x10);
          auVar83 = *(undefined1 (*) [16])
                     ((long)(peVar2->m_Dv).
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                            m_data.array + 0x20);
          auVar116 = *(undefined1 (*) [16])
                      ((long)(peVar2->m_Dv).
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                             m_data.array + 0x30);
          dVar4 = *(double *)
                   ((long)(peVar2->m_Dv).
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data.array + 0x40);
        }
        else {
          vmovsd_avx512f(auVar74);
          vmovsd_avx512f(auVar76);
          vmovsd_avx512f(auVar77);
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
          }
          auVar71 = *(undefined1 (*) [16])
                     (peVar2->m_Dv).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                     m_storage.m_data.array;
          auVar72 = *(undefined1 (*) [16])
                     ((long)(peVar2->m_Dv).
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                            m_data.array + 0x10);
          auVar83 = *(undefined1 (*) [16])
                     ((long)(peVar2->m_Dv).
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                            m_data.array + 0x20);
          auVar116 = *(undefined1 (*) [16])
                      ((long)(peVar2->m_Dv).
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                             m_data.array + 0x30);
          dVar4 = *(double *)
                   ((long)(peVar2->m_Dv).
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data.array + 0x40);
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
          auVar74._8_8_ = 0;
          auVar74._0_8_ = local_4d0;
          auVar76._8_8_ = 0;
          auVar76._0_8_ = local_348;
          auVar77._8_8_ = 0;
          auVar77._0_8_ = dVar8;
        }
        auVar120._8_8_ = 0;
        auVar120._0_8_ = dVar4;
        auVar117._8_8_ = auVar71._0_8_;
        auVar117._0_8_ = auVar71._0_8_;
        auVar79 = vshufpd_avx(auVar71,auVar71,3);
        auVar80 = vshufpd_avx(auVar71,auVar71,1);
        auVar78 = vmovddup_avx512vl(auVar83);
        auVar79 = vmulpd_avx512vl(auVar75,auVar79);
        auVar80 = vmulsd_avx512f(auVar76,auVar80);
        auVar81 = vmulpd_avx512vl(auVar73,auVar117);
        auVar78 = vmulpd_avx512vl(auVar75,auVar78);
        auVar82 = vmovddup_avx512vl(auVar72);
        auVar82 = vmulpd_avx512vl(auVar70,auVar82);
        local_a10 = auVar82._0_8_ + auVar81._0_8_ + auVar79._0_8_;
        dStack_a08 = auVar82._8_8_ + auVar81._8_8_ + auVar79._8_8_;
        auVar71 = vmulsd_avx512f(auVar74,auVar71);
        auVar79 = vshufpd_avx512vl(auVar83,auVar83,1);
        auVar79 = vmulsd_avx512f(auVar77,auVar79);
        auVar81 = vmulsd_avx512f(auVar77,auVar72);
        local_e00._288_8_ = local_a10 * local_518;
        local_e00._296_8_ = dStack_a08 * dStack_510;
        local_b78 = local_a10 * local_3b0;
        dStack_b70 = dStack_a08 * dStack_3a8;
        local_a00 = auVar81._0_8_ + auVar71._0_8_ + auVar80._0_8_;
        auVar71 = vshufpd_avx512vl(auVar72,auVar72,1);
        auVar72 = vshufpd_avx512vl(auVar72,auVar72,3);
        auVar72 = vmulpd_avx512vl(auVar73,auVar72);
        auVar71 = vmulsd_avx512f(auVar74,auVar71);
        local_e00._304_8_ = local_a00 * local_508;
        auVar72 = vaddpd_avx512vl(auVar78,auVar72);
        auVar80 = vshufpd_avx512vl(auVar83,auVar83,3);
        auVar80 = vmulpd_avx512vl(auVar70,auVar80);
        local_b68 = local_a00 * local_3a0;
        local_a10 = local_a10 * local_248;
        dStack_a08 = dStack_a08 * dStack_240;
        auVar72 = vaddpd_avx512vl(auVar80,auVar72);
        auVar83 = vmulsd_avx512f(auVar76,auVar83);
        auVar80 = vshufpd_avx512vl(auVar116,auVar116,3);
        auVar75 = vmulpd_avx512vl(auVar75,auVar80);
        local_a00 = local_a00 * local_238;
        auVar71 = vaddsd_avx512f(auVar83,auVar71);
        auVar83 = vmovddup_avx512vl(auVar116);
        local_e00._312_16_ = vmulpd_avx512vl(auVar72,local_500);
        auVar73 = vmulpd_avx512vl(auVar73,auVar83);
        local_9e8 = auVar79._0_8_ + auVar71._0_8_;
        auVar71 = vshufpd_avx512vl(auVar116,auVar116,1);
        local_b60 = vmulpd_avx512vl(auVar72,local_398);
        auVar71 = vmulsd_avx512f(auVar76,auVar71);
        auVar73 = vaddpd_avx512vl(auVar73,auVar75);
        auVar75 = vmovddup_avx512vl(auVar120);
        local_cb8 = local_9e8 * local_4f0;
        auVar70 = vmulpd_avx512vl(auVar70,auVar75);
        local_b50 = local_9e8 * local_388;
        local_9f8 = vmulpd_avx512vl(auVar72,local_230);
        auVar70 = vaddpd_avx512vl(auVar70,auVar73);
        auVar72 = vmulsd_avx512f(auVar74,auVar116);
        local_9e8 = local_9e8 * local_220;
        auVar62._8_8_ = dStack_4e0;
        auVar62._0_8_ = local_4e8;
        local_cb0 = vmulpd_avx512vl(auVar70,auVar62);
        auVar71 = vaddsd_avx512f(auVar72,auVar71);
        auVar72 = vmulsd_avx512f(auVar77,auVar120);
        auVar71 = vaddsd_avx512f(auVar72,auVar71);
        local_9d0 = auVar71._0_8_;
        local_ca0 = local_9d0 * local_4d8;
        auVar63._8_8_ = dStack_378;
        auVar63._0_8_ = local_380;
        local_b48 = vmulpd_avx512vl(auVar70,auVar63);
        local_b38 = local_9d0 * local_370;
        auVar64._8_8_ = dStack_210;
        auVar64._0_8_ = local_218;
        local_9e0 = vmulpd_avx512vl(auVar70,auVar64);
        local_9d0 = local_9d0 * local_208;
        if ((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
            m_cols != 0x2d) {
          pcVar69 = 
          "Eigen::Product<Eigen::Matrix<double, -1, -1, 1>, Eigen::Matrix<double, 45, 3, 0>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, -1, -1, 1>, Rhs = Eigen::Matrix<double, 45, 3, 0>, Option = 0]"
          ;
          goto LAB_0070adb9;
        }
        if ((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
            m_rows == 8) {
          local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
          array[0x10] = 0.0;
          local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
          array[0x11] = 0.0;
          local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
          array[0x12] = 0.0;
          local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
          array[0x13] = 0.0;
          local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
          array[0x14] = 0.0;
          local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
          array[0x15] = 0.0;
          local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
          array[0x16] = 0.0;
          local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
          array[0x17] = 0.0;
          local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
          array[8] = 0.0;
          local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
          array[9] = 0.0;
          local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
          array[10] = 0.0;
          local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
          array[0xb] = 0.0;
          local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
          array[0xc] = 0.0;
          local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
          array[0xd] = 0.0;
          local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
          array[0xe] = 0.0;
          local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
          array[0xf] = 0.0;
          local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
          array[0] = 0.0;
          local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
          array[1] = 0.0;
          local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
          array[2] = 0.0;
          local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
          array[3] = 0.0;
          local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
          array[4] = 0.0;
          local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
          array[5] = 0.0;
          local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
          array[6] = 0.0;
          local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
          array[7] = 0.0;
          local_e08 = 1.0;
          Eigen::internal::
          generic_product_impl<Eigen::Matrix<double,-1,-1,1,-1,-1>,Eigen::Matrix<double,45,3,0,45,3>,Eigen::DenseShape,Eigen::DenseShape,8>
          ::scaleAndAddTo<Eigen::Matrix<double,8,3,1,8,3>>
                    (&local_200,a_lhs,(Matrix<double,_45,_3,_0,_45,_3> *)local_e00,&local_e08);
          pdVar68 = (Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                    m_data;
          if ((Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
              != 0x18) {
            if (pdVar68 != (double *)0x0) {
              free((void *)pdVar68[-1]);
            }
            pvVar65 = malloc(0x100);
            if (pvVar65 == (void *)0x0) {
              puVar67 = (undefined8 *)__cxa_allocate_exception(8);
              *puVar67 = std::ostream::_M_insert<bool>;
              __cxa_throw(puVar67,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
            }
            *(void **)(((ulong)pvVar65 & 0xffffffffffffffc0) + 0x38) = pvVar65;
            pdVar68 = (double *)(((ulong)pvVar65 & 0xffffffffffffffc0) + 0x40);
            (Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data =
                 pdVar68;
            (Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows =
                 0x18;
          }
          uVar66 = 0xfffffffffffffff8;
          do {
            dVar4 = local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage
                    .m_data.array[uVar66 + 9];
            dVar7 = local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage
                    .m_data.array[uVar66 + 10];
            dVar8 = local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage
                    .m_data.array[uVar66 + 0xb];
            dVar9 = local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage
                    .m_data.array[uVar66 + 0xc];
            dVar10 = local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.
                     m_storage.m_data.array[uVar66 + 0xd];
            dVar11 = local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.
                     m_storage.m_data.array[uVar66 + 0xe];
            dVar12 = local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.
                     m_storage.m_data.array[uVar66 + 0xf];
            pdVar1 = pdVar68 + uVar66 + 8;
            *pdVar1 = local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.
                      m_storage.m_data.array[uVar66 + 8];
            pdVar1[1] = dVar4;
            pdVar1[2] = dVar7;
            pdVar1[3] = dVar8;
            pdVar1[4] = dVar9;
            pdVar1[5] = dVar10;
            pdVar1[6] = dVar11;
            pdVar1[7] = dVar12;
            uVar66 = uVar66 + 8;
          } while (uVar66 < 0x10);
          return;
        }
        pcVar69 = 
        "void Eigen::PlainObjectBase<Eigen::Matrix<double, 8, 3, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, 8, 3, 1>]"
        ;
        goto LAB_0070addb;
      }
      pcVar69 = 
      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::ArrayWrapper<Eigen::Matrix<double, 3, 1>>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Array<double, -1, -1>>, const Eigen::ArrayWrapper<Eigen::Matrix<double, -1, -1>>>, Functor = Eigen::internal::mul_assign_op<double>]"
      ;
    }
    else {
      pcVar69 = 
      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::ArrayWrapper<Eigen::Matrix<double, 12, 1>>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Array<double, -1, -1>>, const Eigen::ArrayWrapper<Eigen::Matrix<double, -1, -1>>>, Functor = Eigen::internal::mul_assign_op<double>]"
      ;
      local_e00._24_8_ = dVar4;
    }
    __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                  "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,pcVar69);
  }
LAB_0070ad1b:
  __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Array<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Array<double, -1, -1>]"
               );
}

Assistant:

void ChElementBeamANCF_3243::ComputeInternalForcesContIntNoDamping(ChVectorDynamic<>& Fi) {
    // Calculate the generalize internal force vector using the "Continuous Integration" style of method assuming a
    // linear material model (no damping).  For this style of method, the generalized internal force vector is
    // integrated across the volume of the element every time this calculation is performed. For this element, this is
    // likely more efficient than the "Pre-Integration" style calculation method.  Note that the integrand for the
    // generalize internal force vector for a straight and normalized element is of order : 8 in xi, 4 in eta, and 4 in
    // zeta. This requires GQ 5 points along the xi direction and 3 GQ points along the eta and zeta directions for
    // "Full Integration". However, very similar results can be obtained with fewer GQ point in each direction,
    // resulting in significantly fewer calculations.  Based on testing, this could be as low as 3x2x2

    Matrix3xN e_bar;
    CalcCoordMatrix(e_bar);

    // =============================================================================
    // Calculate the deformation gradient for all Gauss quadrature points in a single matrix multiplication.  Note
    // that since the shape function derivative matrix is ordered by columns, the resulting deformation gradient
    // will be ordered by block matrix (column vectors) components
    // Note that the indices of the components are in transposed order
    //      [F11  F21  F31 ] <-- D0 Block (No Poisson Effect)
    //      [F12  F22  F32 ] <-- D0 Block (No Poisson Effect)
    // FC = [F13  F23  F33 ] <-- D0 Block (No Poisson Effect)
    //      [F11  F21  F31 ] <-- Dv Block (With Poisson Effect)
    //      [F12  F22  F32 ] <-- Dv Block (With Poisson Effect)
    //      [F13  F23  F33 ] <-- Dv Block (With Poisson Effect)
    // =============================================================================

    ChMatrixNMc<double, 3 * NIP, 3> FC = m_SD.transpose() * e_bar.transpose();

    // =============================================================================
    // =============================================================================
    // Since the Enhanced Continuum Mechanics method is utilized for this element, first calculate the contribution to
    // the generalized internal force vector from the terms that do not include the Poisson effect.  This is integrated
    // across the entire volume of the element using the full number of Gauss quadrature points.
    // =============================================================================
    // =============================================================================

    // =============================================================================
    // Get the diagonal terms of the 6x6 matrix (does not include the Poisson effect)
    // =============================================================================
    const ChVectorN<double, 6>& D0 = GetMaterial()->Get_D0();

    // =============================================================================
    // Calculate each individual value of the Green-Lagrange strain component by component across all the
    // Gauss-Quadrature points at a time to better leverage vectorized CPU instructions.
    // The result is then scaled by minus the Gauss quadrature weight times the element Jacobian at the
    // corresponding Gauss point (m_kGQ) for efficiency. Since only the diagonal terms in the 6x6 stiffness matrix are
    // used, the 2nd Piola-Kirchoff stress can be calculated by simply scaling the vector of scaled Green-Lagrange
    // strains in Voight notation by the corresponding diagonal entry in the stiffness matrix.
    // Results are written in Voigt notation: epsilon = [E11,E22,E33,2*E23,2*E13,2*E12]
    //  kGQ*SPK2 = kGQ*[SPK2_11,SPK2_22,SPK2_33,SPK2_23,SPK2_13,SPK2_12] = D * E_Combined
    // =============================================================================

    // Each entry in SPK2_1 = D11*kGQ*E11 = D11*kGQ*1/2*(F11*F11+F21*F21+F31*F31-1)
    VectorNIP_D0 SPK2_1_Block_D0 = FC.template block<NIP_D0, 1>(0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(0, 0)) +
                                   FC.template block<NIP_D0, 1>(0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(0, 1)) +
                                   FC.template block<NIP_D0, 1>(0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(0, 2));
    SPK2_1_Block_D0.array() -= 1;
    SPK2_1_Block_D0.array() *= (0.5 * D0(0)) * m_kGQ_D0.array();

    // Each entry in SPK2_2 = D22*kGQ*E22 = D22*kGQ*1/2*(F12*F12+F22*F22+F32*F32-1)
    VectorNIP_D0 SPK2_2_Block_D0 =
        FC.template block<NIP_D0, 1>(NIP_D0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 0)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 1)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 2));
    SPK2_2_Block_D0.array() -= 1;
    SPK2_2_Block_D0.array() *= (0.5 * D0(1)) * m_kGQ_D0.array();

    // Each entry in SPK2_3 = D33*kGQ_D0*E33 = D33*kGQ*1/2*(F13*F13+F23*F23+F33*F33-1)
    VectorNIP_D0 SPK2_3_Block_D0 =
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 0)) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 1)) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 2));
    SPK2_3_Block_D0.array() -= 1;
    SPK2_3_Block_D0.array() *= (0.5 * D0(2)) * m_kGQ_D0.array();

    // Each entry in SPK2_4 = D44*kGQ*2*E23 = D44*kGQ*(F12*F13+F22*F23+F32*F33)
    VectorNIP_D0 SPK2_4_Block_D0 =
        FC.template block<NIP_D0, 1>(NIP_D0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 0)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 1)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 2));
    SPK2_4_Block_D0.array() *= D0(3) * m_kGQ_D0.array();

    // Each entry in SPK2_5 = D55*kGQ*2*E13 = D55*kGQ*(F11*F13+F21*F23+F31*F33)
    VectorNIP_D0 SPK2_5_Block_D0 =
        FC.template block<NIP_D0, 1>(0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 0)) +
        FC.template block<NIP_D0, 1>(0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 1)) +
        FC.template block<NIP_D0, 1>(0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 2));
    SPK2_5_Block_D0.array() *= D0(4) * m_kGQ_D0.array();

    // Each entry in SPK2_6 = D66*kGQ*2*E12 = D66*(F11*F12+F21*F22+F31*F32)
    VectorNIP_D0 SPK2_6_Block_D0 =
        FC.template block<NIP_D0, 1>(0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 0)) +
        FC.template block<NIP_D0, 1>(0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 1)) +
        FC.template block<NIP_D0, 1>(0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 2));
    SPK2_6_Block_D0.array() *= D0(5) * m_kGQ_D0.array();

    // =============================================================================
    // Calculate the transpose of the 1st Piola-Kirchoff stresses in block tensor form whose entries have been
    // scaled by minus the Gauss quadrature weight times the element Jacobian at the corresponding Gauss point.
    // The entries are grouped by component in block matrices (column vectors)
    // P_Block = kGQ*P_transpose = kGQ*SPK2*F_transpose
    //           [kGQ*(P_transpose)_11  kGQ*(P_transpose)_12  kGQ*(P_transpose)_13 ] <-- D0 Block
    //           [kGQ*(P_transpose)_21  kGQ*(P_transpose)_22  kGQ*(P_transpose)_23 ] <-- D0 Block
    //         = [kGQ*(P_transpose)_31  kGQ*(P_transpose)_32  kGQ*(P_transpose)_33 ] <-- D0 Block
    //           [kGQ*(P_transpose)_11  kGQ*(P_transpose)_12  kGQ*(P_transpose)_13 ] <-- Dv Block
    //           [kGQ*(P_transpose)_21  kGQ*(P_transpose)_22  kGQ*(P_transpose)_23 ] <-- Dv Block
    //           [kGQ*(P_transpose)_31  kGQ*(P_transpose)_32  kGQ*(P_transpose)_33 ] <-- Dv Block
    // Note that the Dv Blocks entries are calculated in a later step
    // =============================================================================

    ChMatrixNMc<double, 3 * NIP, 3> P_Block;

    P_Block.template block<NIP_D0, 1>(0, 0) = FC.template block<NIP_D0, 1>(0, 0).cwiseProduct(SPK2_1_Block_D0) +
                                              FC.template block<NIP_D0, 1>(NIP_D0, 0).cwiseProduct(SPK2_6_Block_D0) +
                                              FC.template block<NIP_D0, 1>(2 * NIP_D0, 0).cwiseProduct(SPK2_5_Block_D0);
    P_Block.template block<NIP_D0, 1>(0, 1) = FC.template block<NIP_D0, 1>(0, 1).cwiseProduct(SPK2_1_Block_D0) +
                                              FC.template block<NIP_D0, 1>(NIP_D0, 1).cwiseProduct(SPK2_6_Block_D0) +
                                              FC.template block<NIP_D0, 1>(2 * NIP_D0, 1).cwiseProduct(SPK2_5_Block_D0);
    P_Block.template block<NIP_D0, 1>(0, 2) = FC.template block<NIP_D0, 1>(0, 2).cwiseProduct(SPK2_1_Block_D0) +
                                              FC.template block<NIP_D0, 1>(NIP_D0, 2).cwiseProduct(SPK2_6_Block_D0) +
                                              FC.template block<NIP_D0, 1>(2 * NIP_D0, 2).cwiseProduct(SPK2_5_Block_D0);

    P_Block.template block<NIP_D0, 1>(NIP_D0, 0) =
        FC.template block<NIP_D0, 1>(0, 0).cwiseProduct(SPK2_6_Block_D0) +
        FC.template block<NIP_D0, 1>(NIP_D0, 0).cwiseProduct(SPK2_2_Block_D0) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 0).cwiseProduct(SPK2_4_Block_D0);
    P_Block.template block<NIP_D0, 1>(NIP_D0, 1) =
        FC.template block<NIP_D0, 1>(0, 1).cwiseProduct(SPK2_6_Block_D0) +
        FC.template block<NIP_D0, 1>(NIP_D0, 1).cwiseProduct(SPK2_2_Block_D0) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 1).cwiseProduct(SPK2_4_Block_D0);
    P_Block.template block<NIP_D0, 1>(NIP_D0, 2) =
        FC.template block<NIP_D0, 1>(0, 2).cwiseProduct(SPK2_6_Block_D0) +
        FC.template block<NIP_D0, 1>(NIP_D0, 2).cwiseProduct(SPK2_2_Block_D0) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 2).cwiseProduct(SPK2_4_Block_D0);

    P_Block.template block<NIP_D0, 1>(2 * NIP_D0, 0) =
        FC.template block<NIP_D0, 1>(0, 0).cwiseProduct(SPK2_5_Block_D0) +
        FC.template block<NIP_D0, 1>(NIP_D0, 0).cwiseProduct(SPK2_4_Block_D0) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 0).cwiseProduct(SPK2_3_Block_D0);
    P_Block.template block<NIP_D0, 1>(2 * NIP_D0, 1) =
        FC.template block<NIP_D0, 1>(0, 1).cwiseProduct(SPK2_5_Block_D0) +
        FC.template block<NIP_D0, 1>(NIP_D0, 1).cwiseProduct(SPK2_4_Block_D0) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 1).cwiseProduct(SPK2_3_Block_D0);
    P_Block.template block<NIP_D0, 1>(2 * NIP_D0, 2) =
        FC.template block<NIP_D0, 1>(0, 2).cwiseProduct(SPK2_5_Block_D0) +
        FC.template block<NIP_D0, 1>(NIP_D0, 2).cwiseProduct(SPK2_4_Block_D0) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 2).cwiseProduct(SPK2_3_Block_D0);

    // =============================================================================
    // =============================================================================
    // Since the Enhanced Continuum Mechanics method is utilized for this element, second calculate the contribution to
    // the generalized internal force vector from the terms that include the Poisson effect.  This is integrated
    // across the entire volume of the element using Gauss quadrature points only along the beam axis.  It is assumed
    // that an isotropic material or orthotropic material aligned with its principle axes is used
    // =============================================================================
    // =============================================================================

    // =============================================================================
    // Calculate each individual value of the Green-Lagrange strain component by component across all the
    // Gauss-Quadrature points at a time to better leverage vectorized CPU instructions.
    // The combined result is then scaled by minus the Gauss quadrature weight times the element Jacobian at the
    // corresponding Gauss point (m_kGQ) again for efficiency. Results are written in Voigt notation: epsilon =
    // [E11,E22,E33,2*E23,2*E13,2*E12] Note that with the material assumption being used, only [E11,E22,E33] need to be
    // calculated
    // =============================================================================

    // Each entry in E1 = kGQ*E11 = kGQ*1/2*(F11*F11+F21*F21+F31*F31-1)
    VectorNIP_Dv E1_Block_Dv =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 0).cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 0)) +
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 1).cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 1)) +
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 2).cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 2));
    E1_Block_Dv.array() -= 1;
    E1_Block_Dv.array() *= 0.5 * m_kGQ_Dv.array();

    // Each entry in E2 = kGQ*E22 = kGQ*1/2*(F12*F12+F22*F22+F32*F32-1)
    VectorNIP_Dv E2_Block_Dv = FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 0)
                                   .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 0)) +
                               FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 1)
                                   .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 1)) +
                               FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 2)
                                   .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 2));
    E2_Block_Dv.array() -= 1;
    E2_Block_Dv.array() *= 0.5 * m_kGQ_Dv.array();

    // Each entry in E3 = kGQ*E33 = kGQ*1/2*(F13*F13+F23*F23+F33*F33-1)
    VectorNIP_Dv E3_Block_Dv = FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 0)
                                   .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 0)) +
                               FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 1)
                                   .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 1)) +
                               FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 2)
                                   .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 2));
    E3_Block_Dv.array() -= 1;
    E3_Block_Dv.array() *= 0.5 * m_kGQ_Dv.array();

    // =============================================================================
    // Get the upper 3x3 block of the stiffness tensor in 6x6 matrix that accounts for the Poisson effect.  Note that
    // with the split of the stiffness matrix and the assumed materials, the entries in the 6x6 stiffness matrix outside
    // of the upper 3x3 block are all zeros.
    // =============================================================================

    const ChMatrix33<double>& Dv = GetMaterial()->Get_Dv();

    // =============================================================================
    // Calculate the 2nd Piola-Kirchoff stresses in Voigt notation across all the Gauss quadrature points at a time
    // component by component. Note that the Green-Largrange strain components have already been scaled
    // by minus the Gauss quadrature weight times the element Jacobian at the corresponding Gauss point to make the
    // calculation of the 2nd Piola-Kirchoff stresses more efficient.
    //  kGQ*SPK2 = kGQ*[SPK2_11,SPK2_22,SPK2_33,SPK2_23,SPK2_13,SPK2_12] = D * E_Combined
    // =============================================================================

    VectorNIP_Dv SPK2_1_Block_Dv = Dv(0, 0) * E1_Block_Dv + Dv(0, 1) * E2_Block_Dv + Dv(0, 2) * E3_Block_Dv;
    VectorNIP_Dv SPK2_2_Block_Dv = Dv(1, 0) * E1_Block_Dv + Dv(1, 1) * E2_Block_Dv + Dv(1, 2) * E3_Block_Dv;
    VectorNIP_Dv SPK2_3_Block_Dv = Dv(2, 0) * E1_Block_Dv + Dv(2, 1) * E2_Block_Dv + Dv(2, 2) * E3_Block_Dv;

    // =============================================================================
    // Calculate the transpose of the 1st Piola-Kirchoff stresses in block tensor form whose entries have been
    // scaled by minus the Gauss quadrature weight times the element Jacobian at the corresponding Gauss point.
    // The entries are grouped by component in block matrices (column vectors)
    // P_Block = kGQ*P_transpose = kGQ*SPK2*F_transpose
    //           [kGQ*(P_transpose)_11  kGQ*(P_transpose)_12  kGQ*(P_transpose)_13 ] <-- D0 Block
    //           [kGQ*(P_transpose)_21  kGQ*(P_transpose)_22  kGQ*(P_transpose)_23 ] <-- D0 Block
    //         = [kGQ*(P_transpose)_31  kGQ*(P_transpose)_32  kGQ*(P_transpose)_33 ] <-- D0 Block
    //           [kGQ*(P_transpose)_11  kGQ*(P_transpose)_12  kGQ*(P_transpose)_13 ] <-- Dv Block
    //           [kGQ*(P_transpose)_21  kGQ*(P_transpose)_22  kGQ*(P_transpose)_23 ] <-- Dv Block
    //           [kGQ*(P_transpose)_31  kGQ*(P_transpose)_32  kGQ*(P_transpose)_33 ] <-- Dv Block
    // Note that the D0 entries have already been calculated above
    // =============================================================================

    P_Block.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 0) =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 0).cwiseProduct(SPK2_1_Block_Dv);
    P_Block.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 1) =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 1).cwiseProduct(SPK2_1_Block_Dv);
    P_Block.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 2) =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 2).cwiseProduct(SPK2_1_Block_Dv);

    P_Block.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 0) =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 0).cwiseProduct(SPK2_2_Block_Dv);
    P_Block.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 1) =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 1).cwiseProduct(SPK2_2_Block_Dv);
    P_Block.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 2) =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 2).cwiseProduct(SPK2_2_Block_Dv);

    P_Block.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 0) =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 0).cwiseProduct(SPK2_3_Block_Dv);
    P_Block.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 1) =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 1).cwiseProduct(SPK2_3_Block_Dv);
    P_Block.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 2) =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 2).cwiseProduct(SPK2_3_Block_Dv);

    // =============================================================================
    // Multiply the scaled first Piola-Kirchoff stresses by the shape function derivative matrix to get the generalized
    // force vector in matrix form (in the correct order if its calculated in row-major memory layout)
    // =============================================================================

    MatrixNx3 QiCompact = m_SD * P_Block;

    // =============================================================================
    // Reshape the compact matrix form of the generalized internal force vector (stored using a row-major memory layout)
    // into its actual column vector format.  This is done by mathematically stacking the transpose of each row on top
    // of each other forming the column vector.  Due to the memory organization this is simply a reinterpretation of the
    // data
    // =============================================================================

    Eigen::Map<Vector3N> QiReshaped(QiCompact.data(), QiCompact.size());
    Fi = QiReshaped;
}